

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

FT_Error psh_hint_table_init(PSH_Hint_Table table,PS_Hint_Table hints,PS_Mask_Table hint_masks,
                            PS_Mask_Table counter_masks,FT_Memory memory)

{
  FT_Pointer pvVar1;
  PS_Hint pPVar2;
  uint local_54;
  PS_Mask pPStack_50;
  FT_UInt idx;
  PS_Mask mask;
  PS_Hint read;
  PSH_Hint_conflict write;
  FT_Error error;
  FT_UInt count;
  FT_Memory memory_local;
  PS_Mask_Table counter_masks_local;
  PS_Mask_Table hint_masks_local;
  PS_Hint_Table hints_local;
  PSH_Hint_Table table_local;
  
  write._4_4_ = hints->num_hints;
  _error = memory;
  memory_local = (FT_Memory)counter_masks;
  counter_masks_local = hint_masks;
  hint_masks_local = (PS_Mask_Table)hints;
  hints_local = (PS_Hint_Table)table;
  pvVar1 = ft_mem_realloc(memory,8,0,(ulong)(write._4_4_ << 1),(void *)0x0,(FT_Error *)&write);
  *(FT_Pointer *)(hints_local + 1) = pvVar1;
  if ((int)write == 0) {
    pPVar2 = (PS_Hint)ft_mem_realloc(_error,0x30,0,(ulong)write._4_4_,(void *)0x0,(FT_Error *)&write
                                    );
    hints_local->hints = pPVar2;
    if ((int)write == 0) {
      pPVar2 = (PS_Hint)ft_mem_realloc(_error,0x20,0,(ulong)(write._4_4_ * 2 + 1),(void *)0x0,
                                       (FT_Error *)&write);
      hints_local[2].hints = pPVar2;
      if ((int)write == 0) {
        hints_local->num_hints = write._4_4_;
        hints_local[1].hints = (PS_Hint)(*(long *)(hints_local + 1) + (ulong)write._4_4_ * 8);
        hints_local->max_hints = 0;
        hints_local[2].num_hints = 0;
        hints_local[3].num_hints = 0;
        hints_local[3].max_hints = 0;
        read = hints_local->hints;
        mask = hint_masks_local->masks;
        for (; write._4_4_ != 0; write._4_4_ = write._4_4_ - 1) {
          read->pos = mask->num_bits;
          read->len = mask->max_bits;
          read[2].pos = *(FT_Int *)&mask->bytes;
          read = read + 4;
          mask = (PS_Mask)((long)&mask->bytes + 4);
        }
        if (counter_masks_local != (PS_Mask_Table)0x0) {
          pPStack_50 = counter_masks_local->masks;
          write._4_4_ = counter_masks_local->num_masks;
          hints_local[3].hints = (PS_Hint)counter_masks_local;
          for (; write._4_4_ != 0; write._4_4_ = write._4_4_ - 1) {
            psh_hint_table_record_mask((PSH_Hint_Table)hints_local,pPStack_50);
            pPStack_50 = pPStack_50 + 1;
          }
        }
        if (hints_local->max_hints != hints_local->num_hints) {
          write._4_4_ = hints_local->num_hints;
          for (local_54 = 0; local_54 < write._4_4_; local_54 = local_54 + 1) {
            psh_hint_table_record((PSH_Hint_Table)hints_local,local_54);
          }
        }
      }
    }
  }
  return (int)write;
}

Assistant:

static FT_Error
  psh_hint_table_init( PSH_Hint_Table  table,
                       PS_Hint_Table   hints,
                       PS_Mask_Table   hint_masks,
                       PS_Mask_Table   counter_masks,
                       FT_Memory       memory )
  {
    FT_UInt   count;
    FT_Error  error;

    FT_UNUSED( counter_masks );


    count = hints->num_hints;

    /* allocate our tables */
    if ( FT_NEW_ARRAY( table->sort,  2 * count     ) ||
         FT_NEW_ARRAY( table->hints,     count     ) ||
         FT_NEW_ARRAY( table->zones, 2 * count + 1 ) )
      goto Exit;

    table->max_hints   = count;
    table->sort_global = table->sort + count;
    table->num_hints   = 0;
    table->num_zones   = 0;
    table->zone        = NULL;

    /* initialize the `table->hints' array */
    {
      PSH_Hint  write = table->hints;
      PS_Hint   read  = hints->hints;


      for ( ; count > 0; count--, write++, read++ )
      {
        write->org_pos = read->pos;
        write->org_len = read->len;
        write->flags   = read->flags;
      }
    }

    /* we now need to determine the initial `parent' stems; first  */
    /* activate the hints that are given by the initial hint masks */
    if ( hint_masks )
    {
      PS_Mask  mask = hint_masks->masks;


      count             = hint_masks->num_masks;
      table->hint_masks = hint_masks;

      for ( ; count > 0; count--, mask++ )
        psh_hint_table_record_mask( table, mask );
    }

    /* finally, do a linear parse in case some hints were left alone */
    if ( table->num_hints != table->max_hints )
    {
      FT_UInt  idx;


      FT_TRACE0(( "psh_hint_table_init: missing/incorrect hint masks\n" ));

      count = table->max_hints;
      for ( idx = 0; idx < count; idx++ )
        psh_hint_table_record( table, idx );
    }

  Exit:
    return error;
  }